

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int CVmObjDate::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  vm_prop_id_t in_CX;
  uint *in_RDX;
  uchar **in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *unaff_retaddr;
  uint midx;
  vm_prop_id_t in_stack_ffffffffffffffd2;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  iVar1 = CVmMetaTable::prop_to_vector_idx
                    ((CVmMetaTable *)
                     CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd2);
  if (iVar1 == 1) {
    iVar1 = s_getp_parseDate(unaff_retaddr,
                             (uint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else if (iVar1 == 2) {
    iVar1 = s_getp_parseJulianDate
                      (unaff_retaddr,
                       (uint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else if (iVar1 == 0xd) {
    iVar1 = s_getp_setLocaleInfo(result,(uint *)pc_ptr);
  }
  else {
    iVar1 = CVmObject::call_stat_prop(in_RDI,in_RSI,in_RDX,in_CX);
  }
  return iVar1;
}

Assistant:

int CVmObjDate::call_stat_prop(VMG_ vm_val_t *result,
                               const uchar **pc_ptr, uint *argc,
                               vm_prop_id_t prop)
{
    /* look up the function */
    uint midx = G_meta_table
                ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* check for our static properties */
    switch (midx)
    {
    case VMDATE_PARSEDATE:
        return s_getp_parseDate(vmg_ result, argc);
        
    case VMDATE_PARSEJULIANDATE:
        return s_getp_parseJulianDate(vmg_ result, argc);

    case VMDATE_SETLOCALINFO:
        return s_getp_setLocaleInfo(vmg_ result, argc);
    }

    /* not one of hours; inherit the superclass handling */
    return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
}